

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::DisplayComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  uint uVar1;
  FILE *__stream;
  bool bVar2;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_01;
  uint *puVar4;
  reference ppcVar5;
  undefined8 uVar6;
  const_iterator cStack_48;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  NodeList *nl;
  int c;
  int n;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  fprintf(_stderr,"The strongly connected components are:\n");
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  for (nl._0_4_ = 0; (int)(uint)nl < (int)sVar3; nl._0_4_ = (uint)nl + 1) {
    this_01 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_00,(long)(int)(uint)nl)->super_vector<int,_std::allocator<int>_>;
    fprintf(_stderr,"Component (%d):\n",(ulong)(uint)nl);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
    cStack_48 = std::vector<int,_std::allocator<int>_>::end(this_01);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
      if (!bVar2) break;
      puVar4 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&__end2);
      __stream = _stderr;
      uVar1 = *puVar4;
      ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                operator[](&this->Targets,(long)(int)uVar1);
      cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar5);
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"  contains target %d [%s]\n",(ulong)uVar1,uVar6);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayComponents(
  cmComputeComponentGraph const& ccg)
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = ccg.GetComponents();
  int n = static_cast<int>(components.size());
  for (int c = 0; c < n; ++c) {
    NodeList const& nl = components[c];
    fprintf(stderr, "Component (%d):\n", c);
    for (int i : nl) {
      fprintf(stderr, "  contains target %d [%s]\n", i,
              this->Targets[i]->GetName().c_str());
    }
  }
  fprintf(stderr, "\n");
}